

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int32_t nghttp2_submit_request
                  (nghttp2_session *session,nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,
                  size_t nvlen,nghttp2_data_provider *data_prd,void *stream_user_data)

{
  uint8_t flags_00;
  int iVar1;
  int rv;
  uint8_t flags;
  void *stream_user_data_local;
  nghttp2_data_provider *data_prd_local;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  nghttp2_priority_spec *pri_spec_local;
  nghttp2_session *session_local;
  
  if (session->server == '\0') {
    if (((pri_spec == (nghttp2_priority_spec *)0x0) ||
        (iVar1 = nghttp2_priority_spec_check_default(pri_spec), iVar1 != 0)) ||
       ((session->remote_settings).no_rfc7540_priorities == 1)) {
      nva_local = (nghttp2_nv *)0x0;
    }
    else {
      iVar1 = detect_self_dependency(session,-1,pri_spec);
      nva_local = (nghttp2_nv *)pri_spec;
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    flags_00 = set_request_flags((nghttp2_priority_spec *)nva_local,data_prd);
    session_local._4_4_ =
         submit_headers_shared_nva
                   (session,flags_00,-1,(nghttp2_priority_spec *)nva_local,nva,nvlen,data_prd,
                    stream_user_data);
  }
  else {
    session_local._4_4_ = -0x1f9;
  }
  return session_local._4_4_;
}

Assistant:

int32_t nghttp2_submit_request(nghttp2_session *session,
                               const nghttp2_priority_spec *pri_spec,
                               const nghttp2_nv *nva, size_t nvlen,
                               const nghttp2_data_provider *data_prd,
                               void *stream_user_data) {
  uint8_t flags;
  int rv;

  if (session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  if (pri_spec && !nghttp2_priority_spec_check_default(pri_spec) &&
      session->remote_settings.no_rfc7540_priorities != 1) {
    rv = detect_self_dependency(session, -1, pri_spec);
    if (rv != 0) {
      return rv;
    }
  } else {
    pri_spec = NULL;
  }

  flags = set_request_flags(pri_spec, data_prd);

  return submit_headers_shared_nva(session, flags, -1, pri_spec, nva, nvlen,
                                   data_prd, stream_user_data);
}